

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

int __thiscall ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,double *B,double *pivot)

{
  double **ppdVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  double ***pppdVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  int row0;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ulong local_68;
  
  uVar3 = this->m_row_count;
  pppdVar5 = &this->m;
  if (uVar3 == (this->m_rowmem).m_count) {
    pppdVar5 = &(this->m_rowmem).m_a;
  }
  ppdVar1 = *pppdVar5;
  uVar4 = this->m_col_count;
  if ((int)uVar3 < this->m_col_count) {
    uVar4 = uVar3;
  }
  local_68 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    local_68 = 0;
  }
  dVar11 = 0.0;
  uVar8 = 1;
  uVar10 = 0;
  do {
    if (uVar10 == local_68) {
LAB_0050aa73:
      if (pivot != (double *)0x0) {
        *pivot = dVar11;
      }
      return (int)local_68;
    }
    uVar9 = uVar10 & 0xffffffff;
    pdVar6 = ppdVar1[uVar10];
    dVar12 = pdVar6[uVar10];
    dVar13 = ABS(dVar12);
    for (uVar7 = uVar8; (int)uVar7 < (int)uVar3; uVar7 = uVar7 + 1) {
      if (dVar13 < ABS(ppdVar1[uVar7][uVar10])) {
        uVar9 = uVar7 & 0xffffffff;
        dVar13 = ABS(ppdVar1[uVar7][uVar10]);
      }
    }
    dVar2 = dVar13;
    if ((uVar10 != 0) && (dVar11 <= dVar13)) {
      dVar2 = dVar11;
    }
    dVar11 = dVar2;
    if (dVar13 <= zero_tolerance) {
      local_68 = uVar10 & 0xffffffff;
      goto LAB_0050aa73;
    }
    row0 = (int)uVar9;
    if (uVar10 != uVar9) {
      SwapRows(this,row0,(uint)uVar10);
      dVar12 = B[row0];
      B[row0] = B[uVar10];
      B[uVar10] = dVar12;
      pdVar6 = ppdVar1[uVar10];
      dVar12 = pdVar6[uVar10];
    }
    uVar9 = uVar10 + 1;
    pdVar6[uVar10] = 1.0;
    uVar4 = ~(uint)uVar10;
    ON_ArrayScale(this->m_col_count + uVar4,1.0 / dVar12,pdVar6 + uVar9,pdVar6 + uVar9);
    B[uVar10] = (1.0 / dVar12) * B[uVar10];
    for (uVar7 = uVar8; uVar3 = this->m_row_count, (int)uVar7 < (int)uVar3; uVar7 = uVar7 + 1) {
      pdVar6 = ppdVar1[uVar7];
      dVar12 = pdVar6[uVar10];
      pdVar6[uVar10] = 0.0;
      if (zero_tolerance < ABS(dVar12)) {
        ON_Array_aA_plus_B(this->m_col_count + uVar4,-dVar12,ppdVar1[uVar10] + uVar9,pdVar6 + uVar9,
                           pdVar6 + uVar9);
        B[uVar7] = B[uVar7] - dVar12 * B[uVar10];
      }
    }
    uVar8 = uVar8 + 1;
    uVar10 = uVar9;
  } while( true );
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    double* B,
    double* pivot 
    )
{
  double t;
  double x, piv;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    if ( ix != k )
    {
      // swap rows of matrix and B
      SwapRows( ix, k );
      t = B[ix]; B[ix] = B[k]; B[k] = t;
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
    B[k] *= x;

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        B[i] += x*B[k];
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  return rank;
}